

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O0

LINEAR_DATA * linear_data_new(int channels)

{
  float *pfVar1;
  LINEAR_DATA *local_18;
  LINEAR_DATA *priv;
  int channels_local;
  
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                  ,0xb3,"LINEAR_DATA *linear_data_new(int)");
  }
  local_18 = (LINEAR_DATA *)calloc(1,0x30);
  if (local_18 != (LINEAR_DATA *)0x0) {
    local_18->linear_magic_marker = 0x787c4fc;
    pfVar1 = (float *)calloc((long)channels,4);
    local_18->last_value = pfVar1;
    if (local_18->last_value == (float *)0x0) {
      free(local_18);
      local_18 = (LINEAR_DATA *)0x0;
    }
  }
  return local_18;
}

Assistant:

static LINEAR_DATA *
linear_data_new (int channels)
{
	assert (channels > 0) ;

	LINEAR_DATA *priv = (LINEAR_DATA *) calloc (1, sizeof (LINEAR_DATA)) ;
	if (priv)
	{
		priv->linear_magic_marker = LINEAR_MAGIC_MARKER ;
		priv->last_value = (float *) calloc (channels, sizeof (float)) ;
		if (!priv->last_value)
		{
			free (priv) ;
			priv = NULL ;
		}
	}

	return priv ;
}